

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cc
# Opt level: O3

void google::DumpStackTrace(int skip_count,DebugWriter *writerfn,void *arg)

{
  void *pvVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  undefined4 in_register_0000003c;
  char *__s;
  void *stack [32];
  char tmp [1024];
  char buf [1024];
  void *local_938 [32];
  char local_838 [1024];
  char local_438 [1032];
  
  uVar3 = GetStackTrace(local_938,0x20,2);
  if (0 < (int)uVar3) {
    uVar5 = 0;
    do {
      __s = local_838;
      pvVar1 = local_938[uVar5];
      if (fLB::FLAGS_symbolize_stacktrace == '\x01') {
        bVar2 = Symbolize((void *)((long)pvVar1 + -1),__s,0x400);
        pcVar4 = "(unknown)";
        if (bVar2) {
          pcVar4 = __s;
        }
        __s = local_438;
        snprintf(__s,0x400,"%s@ %*p  %s\n","    ",0x12,pvVar1,pcVar4);
      }
      else {
        snprintf(__s,100,"%s@ %*p\n","    ",0x12,pvVar1);
      }
      (*(code *)CONCAT44(in_register_0000003c,skip_count))(__s,writerfn);
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  return;
}

Assistant:

static void DumpStackTrace(int skip_count, DebugWriter* writerfn, void* arg) {
  // Print stack trace
  void* stack[32];
  int depth = GetStackTrace(stack, ARRAYSIZE(stack), skip_count + 1);
  for (int i = 0; i < depth; i++) {
#  if defined(HAVE_SYMBOLIZE)
    if (FLAGS_symbolize_stacktrace) {
      DumpPCAndSymbol(writerfn, arg, stack[i], "    ");
    } else {
      DumpPC(writerfn, arg, stack[i], "    ");
    }
#  else
    DumpPC(writerfn, arg, stack[i], "    ");
#  endif
  }
}